

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O3

void __thiscall FRemapTable::AddIndexRange(FRemapTable *this,int start,int end,int pal1,int pal2)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  
  iVar6 = end;
  iVar3 = start;
  iVar7 = pal2;
  iVar4 = pal1;
  if ((start <= end) && (iVar6 = start, iVar3 = end, iVar7 = pal1, iVar4 = pal2, start == end)) {
    bVar1 = GPalette.Remap[start];
    bVar2 = GPalette.Remap[pal1];
    this->Remap[bVar1] = bVar2;
    *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
     ((long)&this->Palette->field_0 + (ulong)((uint)bVar1 * 4)) = GPalette.BaseColors[bVar2].field_0
    ;
    *(char *)((long)&this->Palette->field_0 + (ulong)((uint)bVar1 * 4) + 3) = -(bVar1 != 0);
    return;
  }
  if (iVar6 <= iVar3) {
    dVar8 = (double)iVar7;
    dVar9 = (double)iVar4 - dVar8;
    if (end < start) {
      start = end;
    }
    lVar5 = 0;
    do {
      bVar1 = *(byte *)((long)start + 0xa73fe0 + lVar5);
      bVar2 = GPalette.Remap[(int)dVar8];
      this->Remap[bVar1] = bVar2;
      *(anon_union_4_2_12391d7c_for_PalEntry_0 *)
       ((long)&this->Palette->field_0 + (ulong)((uint)bVar1 * 4)) =
           GPalette.BaseColors[bVar2].field_0;
      *(char *)((long)&this->Palette->field_0 + (ulong)((uint)bVar1 * 4) + 3) = -(bVar1 != 0);
      dVar8 = dVar8 + dVar9 / (double)(iVar3 - iVar6);
      lVar5 = lVar5 + 1;
    } while ((iVar3 - start) + 1 != (int)lVar5);
  }
  return;
}

Assistant:

void FRemapTable::AddIndexRange(int start, int end, int pal1, int pal2)
{
	double palcol, palstep;

	if (start > end)
	{
		swapvalues (start, end);
		swapvalues (pal1, pal2);
	}
	else if (start == end)
	{
		start = GPalette.Remap[start];
		pal1 = GPalette.Remap[pal1];
		Remap[start] = pal1;
		Palette[start] = GPalette.BaseColors[pal1];
		Palette[start].a = start == 0 ? 0 : 255;
		return;
	}
	palcol = pal1;
	palstep = (pal2 - palcol) / (end - start);
	for (int i = start; i <= end; palcol += palstep, ++i)
	{
		int j = GPalette.Remap[i], k = GPalette.Remap[int(palcol)];
		Remap[j] = k;
		Palette[j] = GPalette.BaseColors[k];
		Palette[j].a = j == 0 ? 0 : 255;
	}
}